

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WithQueensAsTrump.h
# Opt level: O0

void __thiscall WithQueensAsTrump::WithQueensAsTrump(WithQueensAsTrump *this)

{
  initializer_list<Card> __l;
  allocator<Card> local_65 [13];
  Card local_58;
  Card local_50;
  Card local_48;
  Card local_40;
  iterator local_38;
  size_type local_30;
  vector<Card,_std::allocator<Card>_> local_28;
  WithQueensAsTrump *local_10;
  WithQueensAsTrump *this_local;
  
  local_10 = this;
  DifferentTrumpRule::DifferentTrumpRule(&this->super_DifferentTrumpRule);
  (this->super_DifferentTrumpRule).super_Rule._vptr_Rule = (_func_int **)&PTR_isTrump_00127cc8;
  Card::Card(&local_58,DIAMONDS,QUEEN);
  Card::Card(&local_50,HEARTS,QUEEN);
  Card::Card(&local_48,SPADES,QUEEN);
  Card::Card(&local_40,CLUBS,QUEEN);
  local_38 = &local_58;
  local_30 = 4;
  std::allocator<Card>::allocator(local_65);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<Card,_std::allocator<Card>_>::vector(&local_28,__l,local_65);
  std::vector<Card,_std::allocator<Card>_>::operator=
            (&(this->super_DifferentTrumpRule).m_trumpCards,&local_28);
  std::vector<Card,_std::allocator<Card>_>::~vector(&local_28);
  std::allocator<Card>::~allocator(local_65);
  return;
}

Assistant:

WithQueensAsTrump() {
        m_trumpCards = std::vector<Card>{
                Card(Suit::DIAMONDS, CardValue::QUEEN),
                Card(Suit::HEARTS, CardValue::QUEEN),
                Card(Suit::SPADES, CardValue::QUEEN),
                Card(Suit::CLUBS, CardValue::QUEEN),
                };
    }